

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 (*pauVar29) [16];
  bool bVar30;
  bool bVar31;
  int iVar32;
  ulong uVar33;
  ulong unaff_R12;
  size_t mask;
  long lVar34;
  byte bVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar64 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar52 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar64 = ZEXT1664(auVar52);
  }
  local_1028 = *(float *)&(query->p).field_0;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_1038 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1048 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  local_1010 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  bVar31 = false;
  local_1018 = unaff_R12;
  do {
    auVar11._4_4_ = fStack_1024;
    auVar11._0_4_ = local_1028;
    auVar11._8_4_ = fStack_1020;
    auVar11._12_4_ = fStack_101c;
    local_fa8 = vsubps_avx(auVar11,auVar52);
    fVar7 = auVar52._0_4_;
    fVar8 = auVar52._4_4_;
    fVar9 = auVar52._8_4_;
    fVar10 = auVar52._12_4_;
    local_fb8 = local_1028 + fVar7;
    fStack_fb4 = fStack_1024 + fVar8;
    fStack_fb0 = fStack_1020 + fVar9;
    fStack_fac = fStack_101c + fVar10;
    auVar40._4_4_ = fStack_1034;
    auVar40._0_4_ = local_1038;
    auVar40._8_4_ = fStack_1030;
    auVar40._12_4_ = fStack_102c;
    local_fc8 = vsubps_avx(auVar40,auVar42);
    local_fd8 = local_1038 + auVar42._0_4_;
    fStack_fd4 = fStack_1034 + auVar42._4_4_;
    fStack_fd0 = fStack_1030 + auVar42._8_4_;
    fStack_fcc = fStack_102c + auVar42._12_4_;
    auVar44._4_4_ = fStack_1044;
    auVar44._0_4_ = local_1048;
    auVar44._8_4_ = fStack_1040;
    auVar44._12_4_ = fStack_103c;
    local_fe8 = vsubps_avx(auVar44,auVar46);
    local_ff8._0_4_ = local_1048 + auVar46._0_4_;
    local_ff8._4_4_ = fStack_1044 + auVar46._4_4_;
    local_ff8._8_4_ = fStack_1040 + auVar46._8_4_;
    local_ff8._12_4_ = fStack_103c + auVar46._12_4_;
    local_f88 = fVar7 * fVar7;
    fStack_f84 = fVar8 * fVar8;
    fStack_f80 = fVar9 * fVar9;
    fStack_f7c = fVar10 * fVar10;
    local_f98 = auVar64._0_16_;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar31;
          }
          pauVar29 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (auVar64._0_4_ < *(float *)(*pauVar29 + 8));
        uVar39 = *(ulong *)*local_1010;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar39 & 8) == 0) {
              auVar24._4_4_ = fStack_1024;
              auVar24._0_4_ = local_1028;
              auVar24._8_4_ = fStack_1020;
              auVar24._12_4_ = fStack_101c;
              auVar52 = vmaxps_avx(auVar24,*(undefined1 (*) [16])(uVar39 + 0x20));
              auVar52 = vminps_avx(auVar52,*(undefined1 (*) [16])(uVar39 + 0x30));
              auVar46 = vsubps_avx(auVar52,auVar24);
              auVar22._4_4_ = fStack_1034;
              auVar22._0_4_ = local_1038;
              auVar22._8_4_ = fStack_1030;
              auVar22._12_4_ = fStack_102c;
              auVar52 = vmaxps_avx(auVar22,*(undefined1 (*) [16])(uVar39 + 0x40));
              auVar42 = vminps_avx(auVar52,*(undefined1 (*) [16])(uVar39 + 0x50));
              auVar20._4_4_ = fStack_1044;
              auVar20._0_4_ = local_1048;
              auVar20._8_4_ = fStack_1040;
              auVar20._12_4_ = fStack_103c;
              auVar52 = vmaxps_avx(auVar20,*(undefined1 (*) [16])(uVar39 + 0x60));
              auVar52 = vminps_avx(auVar52,*(undefined1 (*) [16])(uVar39 + 0x70));
              auVar42 = vsubps_avx(auVar42,auVar22);
              auVar52 = vsubps_avx(auVar52,auVar20);
              local_1058._0_4_ =
                   auVar46._0_4_ * auVar46._0_4_ + auVar42._0_4_ * auVar42._0_4_ +
                   auVar52._0_4_ * auVar52._0_4_;
              local_1058._4_4_ =
                   auVar46._4_4_ * auVar46._4_4_ + auVar42._4_4_ * auVar42._4_4_ +
                   auVar52._4_4_ * auVar52._4_4_;
              local_1058._8_4_ =
                   auVar46._8_4_ * auVar46._8_4_ + auVar42._8_4_ * auVar42._8_4_ +
                   auVar52._8_4_ * auVar52._8_4_;
              local_1058._12_4_ =
                   auVar46._12_4_ * auVar46._12_4_ + auVar42._12_4_ * auVar42._12_4_ +
                   auVar52._12_4_ * auVar52._12_4_;
              auVar28._4_4_ = fStack_f84;
              auVar28._0_4_ = local_f88;
              auVar28._8_4_ = fStack_f80;
              auVar28._12_4_ = fStack_f7c;
              uVar12 = vcmpps_avx512vl(local_1058,auVar28,2);
              uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x20),
                                       *(undefined1 (*) [16])(uVar39 + 0x30),2);
              local_1018 = CONCAT44((int)(local_1018 >> 0x20),
                                    (uint)(byte)((byte)uVar12 & (byte)uVar13));
            }
          }
          else if ((uVar39 & 8) == 0) {
            auVar52 = *(undefined1 (*) [16])(uVar39 + 0x20);
            auVar42 = *(undefined1 (*) [16])(uVar39 + 0x30);
            auVar25._4_4_ = fStack_1024;
            auVar25._0_4_ = local_1028;
            auVar25._8_4_ = fStack_1020;
            auVar25._12_4_ = fStack_101c;
            auVar46 = vmaxps_avx(auVar25,auVar52);
            auVar46 = vminps_avx(auVar46,auVar42);
            auVar44 = vsubps_avx(auVar46,auVar25);
            auVar23._4_4_ = fStack_1034;
            auVar23._0_4_ = local_1038;
            auVar23._8_4_ = fStack_1030;
            auVar23._12_4_ = fStack_102c;
            auVar46 = vmaxps_avx(auVar23,*(undefined1 (*) [16])(uVar39 + 0x40));
            auVar46 = vminps_avx(auVar46,*(undefined1 (*) [16])(uVar39 + 0x50));
            auVar40 = vsubps_avx(auVar46,auVar23);
            auVar21._4_4_ = fStack_1044;
            auVar21._0_4_ = local_1048;
            auVar21._8_4_ = fStack_1040;
            auVar21._12_4_ = fStack_103c;
            auVar46 = vmaxps_avx(auVar21,*(undefined1 (*) [16])(uVar39 + 0x60));
            auVar46 = vminps_avx(auVar46,*(undefined1 (*) [16])(uVar39 + 0x70));
            auVar46 = vsubps_avx(auVar46,auVar21);
            local_1058._0_4_ =
                 auVar44._0_4_ * auVar44._0_4_ + auVar40._0_4_ * auVar40._0_4_ +
                 auVar46._0_4_ * auVar46._0_4_;
            local_1058._4_4_ =
                 auVar44._4_4_ * auVar44._4_4_ + auVar40._4_4_ * auVar40._4_4_ +
                 auVar46._4_4_ * auVar46._4_4_;
            local_1058._8_4_ =
                 auVar44._8_4_ * auVar44._8_4_ + auVar40._8_4_ * auVar40._8_4_ +
                 auVar46._8_4_ * auVar46._8_4_;
            local_1058._12_4_ =
                 auVar44._12_4_ * auVar44._12_4_ + auVar40._12_4_ * auVar40._12_4_ +
                 auVar46._12_4_ * auVar46._12_4_;
            uVar12 = vcmpps_avx512vl(auVar52,auVar42,2);
            uVar13 = vcmpps_avx512vl(auVar42,local_fa8,1);
            auVar27._4_4_ = fStack_fb4;
            auVar27._0_4_ = local_fb8;
            auVar27._8_4_ = fStack_fb0;
            auVar27._12_4_ = fStack_fac;
            uVar14 = vcmpps_avx512vl(auVar52,auVar27,6);
            uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x50),local_fc8,1);
            auVar26._4_4_ = fStack_fd4;
            auVar26._0_4_ = local_fd8;
            auVar26._8_4_ = fStack_fd0;
            auVar26._12_4_ = fStack_fcc;
            uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x40),auVar26,6);
            uVar17 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x70),local_fe8,1);
            uVar18 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x60),local_ff8,6);
            local_1018 = (ulong)(byte)(~((byte)uVar16 | (byte)uVar14 | (byte)uVar18 | (byte)uVar13 |
                                         (byte)uVar15 | (byte)uVar17) & (byte)uVar12);
          }
          if ((uVar39 & 8) == 0) {
            if (local_1018 == 0) {
              iVar32 = 4;
            }
            else {
              uVar37 = uVar39 & 0xfffffffffffffff0;
              lVar34 = 0;
              for (uVar39 = local_1018; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                  ) {
                lVar34 = lVar34 + 1;
              }
              iVar32 = 0;
              uVar33 = local_1018 - 1 & local_1018;
              uVar39 = *(ulong *)(uVar37 + lVar34 * 8);
              if (uVar33 != 0) {
                uVar4 = *(uint *)(local_1058 + lVar34 * 4);
                lVar34 = 0;
                for (uVar19 = uVar33; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                uVar33 = uVar33 - 1 & uVar33;
                uVar19 = *(ulong *)(uVar37 + lVar34 * 8);
                uVar3 = *(uint *)(local_1058 + lVar34 * 4);
                if (uVar33 == 0) {
                  if (uVar4 < uVar3) {
                    *(ulong *)*local_1010 = uVar19;
                    *(uint *)(*local_1010 + 8) = uVar3;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar39;
                    *(uint *)(*local_1010 + 8) = uVar4;
                    local_1010 = local_1010 + 1;
                    uVar39 = uVar19;
                  }
                }
                else {
                  auVar59._8_8_ = 0;
                  auVar59._0_8_ = uVar39;
                  auVar52 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar4));
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar19;
                  auVar42 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar3));
                  lVar34 = 0;
                  for (uVar39 = uVar33; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    lVar34 = lVar34 + 1;
                  }
                  uVar33 = uVar33 - 1 & uVar33;
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar37 + lVar34 * 8);
                  auVar46 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_1058 + lVar34 * 4)));
                  if (uVar33 == 0) {
                    auVar44 = vpshufd_avx(auVar52,0xaa);
                    auVar40 = vpshufd_avx(auVar42,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar40,auVar44);
                    uVar39 = uVar39 & 0xf;
                    auVar40 = vpblendmd_avx512vl(auVar42,auVar52);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar41._0_4_ = (uint)bVar30 * auVar40._0_4_ | (uint)!bVar30 * auVar44._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar41._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar44._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar41._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar44._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar41._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar44._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar42);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar43._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar43._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar43._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar43._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vpshufd_avx(auVar41,0xaa);
                    auVar42 = vpshufd_avx(auVar46,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar42,auVar52);
                    uVar39 = uVar39 & 0xf;
                    auVar44 = vpblendmd_avx512vl(auVar46,auVar41);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar42 = vmovdqa32_avx512vl(auVar46);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar45._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar41._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar45._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar41._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar45._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar41._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar45._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar41._12_4_;
                    auVar42 = vpshufd_avx(auVar45,0xaa);
                    auVar46 = vpshufd_avx(auVar43,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar42,auVar46);
                    uVar39 = uVar39 & 0xf;
                    auVar46 = vpblendmd_avx512vl(auVar45,auVar43);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar47._0_4_ = (uint)bVar5 * auVar46._0_4_ | (uint)!bVar5 * auVar42._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar47._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar42._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar47._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar42._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar47._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar42._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar45);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar48._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar43._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar48._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar43._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar48._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar43._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar48._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar43._12_4_;
                    *local_1010 = auVar48;
                    local_1010[1] = auVar47;
                    local_1010 = local_1010 + 2;
                    uVar39 = CONCAT44((uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar52._4_4_,
                                      (uint)bVar30 * auVar44._0_4_ | (uint)!bVar30 * auVar52._0_4_);
                  }
                  else {
                    lVar34 = 0;
                    for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                      lVar34 = lVar34 + 1;
                    }
                    uVar4 = *(uint *)(local_1058 + lVar34 * 4);
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = *(ulong *)(uVar37 + lVar34 * 8);
                    auVar11 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar4));
                    auVar44 = vpshufd_avx(auVar52,0xaa);
                    auVar40 = vpshufd_avx(auVar42,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar40,auVar44);
                    uVar39 = uVar39 & 0xf;
                    auVar40 = vpblendmd_avx512vl(auVar42,auVar52);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar49._0_4_ = (uint)bVar30 * auVar40._0_4_ | (uint)!bVar30 * auVar44._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar49._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar44._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar49._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar44._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar49._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar44._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar42);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar50._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar50._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar50._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar50._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vpshufd_avx(auVar46,0xaa);
                    auVar63._4_4_ = uVar4;
                    auVar63._0_4_ = uVar4;
                    auVar63._8_4_ = uVar4;
                    auVar63._12_4_ = uVar4;
                    uVar39 = vpcmpgtd_avx512vl(auVar63,auVar52);
                    uVar39 = uVar39 & 0xf;
                    auVar42 = vpblendmd_avx512vl(auVar11,auVar46);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar51._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar51._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar51._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar51._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vmovdqa32_avx512vl(auVar11);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar53._0_4_ = (uint)bVar30 * auVar52._0_4_ | (uint)!bVar30 * auVar46._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar53._4_4_ = (uint)bVar30 * auVar52._4_4_ | (uint)!bVar30 * auVar46._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar53._8_4_ = (uint)bVar30 * auVar52._8_4_ | (uint)!bVar30 * auVar46._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar53._12_4_ = (uint)bVar30 * auVar52._12_4_ | (uint)!bVar30 * auVar46._12_4_;
                    auVar52 = vpshufd_avx(auVar53,0xaa);
                    auVar42 = vpshufd_avx(auVar50,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar52,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar42 = vpblendmd_avx512vl(auVar53,auVar50);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar54._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar54._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar54._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar54._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vmovdqa32_avx512vl(auVar53);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar55._0_4_ = (uint)bVar30 * auVar52._0_4_ | !bVar30 * auVar50._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar55._4_4_ = (uint)bVar30 * auVar52._4_4_ | !bVar30 * auVar50._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar55._8_4_ = (uint)bVar30 * auVar52._8_4_ | !bVar30 * auVar50._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar55._12_4_ = (uint)bVar30 * auVar52._12_4_ | !bVar30 * auVar50._12_4_;
                    auVar52 = vpshufd_avx(auVar51,0xaa);
                    auVar42 = vpshufd_avx(auVar49,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar52,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar44 = vpblendmd_avx512vl(auVar51,auVar49);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar42 = vmovdqa32_avx512vl(auVar51);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar56._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar49._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar56._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar49._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar56._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar49._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar56._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar49._12_4_;
                    auVar42 = vpshufd_avx(auVar56,0xaa);
                    auVar46 = vpshufd_avx(auVar54,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar46,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar46 = vpblendmd_avx512vl(auVar54,auVar56);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar57._0_4_ = (uint)bVar5 * auVar46._0_4_ | (uint)!bVar5 * auVar42._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar57._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar42._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar57._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar42._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar57._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar42._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar54);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar58._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar56._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar58._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar56._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar58._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar56._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar58._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar56._12_4_;
                    *local_1010 = auVar55;
                    local_1010[1] = auVar58;
                    local_1010[2] = auVar57;
                    local_1010 = local_1010 + 3;
                    uVar39 = CONCAT44((uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar52._4_4_,
                                      (uint)bVar30 * auVar44._0_4_ | (uint)!bVar30 * auVar52._0_4_);
                    iVar32 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar32 = 6;
          }
        } while (iVar32 == 0);
      } while ((iVar32 != 6) || (local_1008 = (ulong)((uint)uVar39 & 0xf) - 8, local_1008 == 0));
      lVar38 = (uVar39 & 0xfffffffffffffff0) + 0xd0;
      lVar34 = 0;
      uVar39 = 0;
      do {
        local_1000 = uVar39;
        lVar36 = -0x10;
        bVar35 = 0;
        do {
          uVar4 = *(uint *)(lVar38 + lVar36);
          if ((ulong)uVar4 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar4].ptr;
          context->geomID = uVar4;
          context->primID = *(uint *)(lVar38 + 0x10 + lVar36);
          bVar30 = Geometry::pointQuery(this,query,context);
          bVar35 = bVar35 | bVar30;
          lVar36 = lVar36 + 4;
        } while (lVar36 != 0);
        uVar39 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar35);
        lVar34 = lVar34 + 1;
        lVar38 = lVar38 + 0xe0;
      } while (lVar34 != local_1008);
      auVar64 = ZEXT1664(local_f98);
    } while ((local_1000 & 1) == 0 && bVar35 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar52._4_4_ = uVar1;
    auVar52._0_4_ = uVar1;
    auVar52._8_4_ = uVar1;
    auVar52._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar42._4_4_ = uVar1;
    auVar42._0_4_ = uVar1;
    auVar42._8_4_ = uVar1;
    auVar42._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar46._4_4_ = uVar1;
    auVar46._0_4_ = uVar1;
    auVar46._8_4_ = uVar1;
    auVar46._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar64 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar44 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar64 = ZEXT1664(auVar44);
    }
    bVar31 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }